

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstring_agg.cpp
# Opt level: O0

void duckdb::BindBitString<long>(AggregateFunctionSet *bitstring_agg,LogicalTypeId *type)

{
  initializer_list<duckdb::LogicalType> iVar1;
  LogicalTypeId *in_RSI;
  AggregateFunction function;
  AggregateFunction *in_stack_fffffffffffffb48;
  AggregateFunction *in_stack_fffffffffffffb50;
  AggregateFunction *in_stack_fffffffffffffb58;
  AggregateFunction *in_stack_fffffffffffffb60;
  LogicalType *local_478;
  LogicalType *in_stack_fffffffffffffba0;
  LogicalType *in_stack_fffffffffffffba8;
  LogicalType local_320 [24];
  LogicalType local_308 [24];
  LogicalType local_2f0 [24];
  LogicalType *local_2d8;
  undefined8 local_2d0;
  LogicalType local_170 [24];
  LogicalType local_158 [264];
  code *local_50;
  code *local_40;
  code *local_38;
  code *local_30;
  LogicalTypeId *local_10;
  
  local_10 = in_RSI;
  duckdb::LogicalType::LogicalType(local_158,*in_RSI);
  duckdb::LogicalType::LogicalType(local_170,BIT);
  AggregateFunction::
  UnaryAggregateDestructor<duckdb::BitAggState<long>,long,duckdb::string_t,duckdb::BitStringAggOperation,(duckdb::AggregateDestructorType)0>
            (in_stack_fffffffffffffba8,in_stack_fffffffffffffba0);
  duckdb::LogicalType::~LogicalType(local_170);
  duckdb::LogicalType::~LogicalType(local_158);
  local_50 = BindBitstringAgg;
  local_38 = BitstringAggBindData::Serialize;
  local_30 = BitstringAggBindData::Deserialize;
  local_40 = BitstringPropagateStats;
  AggregateFunction::AggregateFunction(in_stack_fffffffffffffb60,in_stack_fffffffffffffb58);
  FunctionSet<duckdb::AggregateFunction>::AddFunction
            ((FunctionSet<duckdb::AggregateFunction> *)in_stack_fffffffffffffb50,
             in_stack_fffffffffffffb48);
  AggregateFunction::~AggregateFunction(in_stack_fffffffffffffb50);
  duckdb::LogicalType::LogicalType(local_320,*local_10);
  duckdb::LogicalType::LogicalType(local_308,*local_10);
  duckdb::LogicalType::LogicalType(local_2f0,*local_10);
  local_2d8 = local_320;
  local_2d0 = 3;
  std::allocator<duckdb::LogicalType>::allocator((allocator<duckdb::LogicalType> *)0x82f211);
  iVar1._M_len = (size_type)in_stack_fffffffffffffb60;
  iVar1._M_array = (iterator)in_stack_fffffffffffffb58;
  vector<duckdb::LogicalType,_true>::vector
            ((vector<duckdb::LogicalType,_true> *)in_stack_fffffffffffffb50,iVar1,
             (allocator_type *)in_stack_fffffffffffffb48);
  vector<duckdb::LogicalType,_true>::operator=
            ((vector<duckdb::LogicalType,_true> *)in_stack_fffffffffffffb50,
             (vector<duckdb::LogicalType,_true> *)in_stack_fffffffffffffb48);
  vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0x82f25b);
  std::allocator<duckdb::LogicalType>::~allocator((allocator<duckdb::LogicalType> *)0x82f268);
  local_478 = (LogicalType *)&local_2d8;
  do {
    local_478 = local_478 + -0x18;
    duckdb::LogicalType::~LogicalType(local_478);
  } while (local_478 != local_320);
  local_40 = (code *)0x0;
  AggregateFunction::AggregateFunction(in_stack_fffffffffffffb60,in_stack_fffffffffffffb58);
  FunctionSet<duckdb::AggregateFunction>::AddFunction
            ((FunctionSet<duckdb::AggregateFunction> *)in_stack_fffffffffffffb50,
             in_stack_fffffffffffffb48);
  AggregateFunction::~AggregateFunction(in_stack_fffffffffffffb50);
  AggregateFunction::~AggregateFunction(in_stack_fffffffffffffb50);
  return;
}

Assistant:

static void BindBitString(AggregateFunctionSet &bitstring_agg, const LogicalTypeId &type) {
	auto function =
	    AggregateFunction::UnaryAggregateDestructor<BitAggState<TYPE>, TYPE, string_t, BitStringAggOperation>(
	        type, LogicalType::BIT);
	function.bind = BindBitstringAgg; // create new a 'BitstringAggBindData'
	function.serialize = BitstringAggBindData::Serialize;
	function.deserialize = BitstringAggBindData::Deserialize;
	function.statistics = BitstringPropagateStats; // stores min and max from column stats in BitstringAggBindData
	bitstring_agg.AddFunction(function); // uses the BitstringAggBindData to access statistics for creating bitstring
	function.arguments = {type, type, type};
	function.statistics = nullptr; // min and max are provided as arguments
	bitstring_agg.AddFunction(function);
}